

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

bool __thiscall
SingleNodeColumnSampler<long_double,_float>::sample_col
          (SingleNodeColumnSampler<long_double,_float> *this,size_t *col_chosen,
          Xoshiro256PP *rnd_generator)

{
  pointer puVar1;
  unsigned_long uVar2;
  size_type sVar3;
  long lVar4;
  result_type rVar5;
  double *pdVar6;
  runtime_error *this_00;
  ulong uVar7;
  size_t sVar8;
  size_t lev;
  result_type rVar9;
  ulong uVar10;
  bool bVar11;
  longdouble in_ST0;
  longdouble lVar12;
  double dVar13;
  result_type_conflict1 rVar14;
  reference rVar15;
  allocator<char> local_164;
  allocator<char> local_163;
  allocator<char> local_162;
  allocator<char> local_161;
  size_type *local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_160 = col_chosen;
  if (this->using_tree == false) {
    if (this->backup_weights == true) {
      this->weights_orig =
           (this->weights_own).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    if (this->n_inf != 0) {
      lVar4 = this->n_inf - 1;
      local_158._M_dataplus._M_p = (pointer)0x0;
      local_158._M_string_length._0_2_ = (undefined2)lVar4;
      local_158._M_string_length._2_6_ = (undefined6)((ulong)lVar4 >> 0x10);
      rVar5 = std::uniform_int_distribution<unsigned_long>::operator()
                        ((uniform_int_distribution<unsigned_long> *)&local_158,rnd_generator);
      rVar9 = 0;
      for (uVar7 = 0; uVar7 < this->curr_pos; uVar7 = uVar7 + 1) {
        rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&this->inifinite_weights,this->col_indices[uVar7]);
        rVar9 = (rVar9 + 1) - (ulong)((rVar15._M_mask & *rVar15._M_p) == 0);
        if (rVar9 == rVar5) {
          *local_160 = this->col_indices[uVar7];
          this->n_inf = this->n_inf - 1;
          rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&this->inifinite_weights,*local_160);
          *rVar15._M_p = *rVar15._M_p & ~rVar15._M_mask;
          goto LAB_0025fb4e;
        }
      }
    }
    if (this->n_left == 0) {
      return false;
    }
    lVar12 = (longdouble)0;
    local_158.field_2._0_10_ = this->cumw;
    if (this->cumw <= lVar12) {
      this->cumw = lVar12;
      for (sVar8 = 0; this->curr_pos != sVar8; sVar8 = sVar8 + 1) {
        lVar12 = lVar12 + (longdouble)this->weights_orig[this->col_indices[sVar8]];
        this->cumw = lVar12;
      }
      local_158.field_2._0_10_ = lVar12;
      if (lVar12 <= (longdouble)0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"Unexpected error in ",&local_161);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/david-cortes[P]isotree/src/utils.hpp"
                   ,&local_162);
        std::operator+(&local_90,&local_b0,&local_d0);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,":",&local_163);
        std::operator+(&local_70,&local_90,&local_f0);
        std::__cxx11::to_string(&local_110,0x4c0);
        std::operator+(&local_50,&local_70,&local_110);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,
                   ". Please open an issue in GitHub with this information, indicating the installed version of \'isotree\'.\n"
                   ,&local_164);
        std::operator+(&local_158,&local_50,&local_130);
        std::runtime_error::runtime_error(this_00,(string *)&local_158);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    local_158._M_dataplus._M_p = SUB108((longdouble)0,0);
    local_158._M_string_length._0_2_ = (undefined2)((unkuint10)(longdouble)0 >> 0x40);
    std::uniform_real_distribution<long_double>::operator()
              ((uniform_real_distribution<long_double> *)&local_158,rnd_generator);
    lVar12 = (longdouble)0;
    pdVar6 = this->weights_orig;
    sVar8 = 0;
    do {
      if (this->curr_pos == sVar8) {
        sVar3 = this->col_indices[this->curr_pos - 1];
        *local_160 = sVar3;
        this->cumw = this->cumw - (longdouble)pdVar6[sVar3];
        pdVar6[sVar3] = 0.0;
        goto LAB_0025fb4e;
      }
      sVar3 = this->col_indices[sVar8];
      dVar13 = pdVar6[sVar3];
      lVar12 = lVar12 + (longdouble)dVar13;
      sVar8 = sVar8 + 1;
    } while (lVar12 < in_ST0);
    *local_160 = sVar3;
    this->cumw = this->cumw - (longdouble)dVar13;
    pdVar6[sVar3] = 0.0;
  }
  else {
    if (this->n_inf == 0) {
      if (this->n_left != 0) {
        pdVar6 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar13 = *pdVar6;
        if (0.0 < dVar13) {
          uVar7 = 0;
          for (uVar10 = 0; uVar10 < this->tree_levels; uVar10 = uVar10 + 1) {
            local_158._M_dataplus._M_p = (pointer)0x0;
            local_158._M_string_length._0_2_ = SUB82(dVar13,0);
            local_158._M_string_length._2_6_ = (undefined6)((ulong)dVar13 >> 0x10);
            rVar14 = std::uniform_real_distribution<double>::operator()
                               ((uniform_real_distribution<double> *)&local_158,rnd_generator);
            pdVar6 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar7 = (uVar7 * 2 + 2) - (ulong)(rVar14 < pdVar6[uVar7 * 2 + 1]);
            dVar13 = pdVar6[uVar7];
          }
          *local_160 = (this->mapped_indices).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar7 - this->offset];
          pdVar6[uVar7] = 0.0;
          sVar8 = this->tree_levels;
          while (bVar11 = sVar8 != 0, sVar8 = sVar8 - 1, bVar11) {
            lVar4 = uVar7 * 8;
            uVar7 = uVar7 - 1 >> 1;
            uVar10 = lVar4 - 8U | 8;
            pdVar6[uVar7] =
                 *(double *)((long)pdVar6 + uVar10) + *(double *)((long)pdVar6 + uVar10 + 8);
          }
          goto LAB_0025fb4e;
        }
      }
      return false;
    }
    lVar4 = this->n_inf - 1;
    local_158._M_dataplus._M_p = (pointer)0x0;
    local_158._M_string_length._0_2_ = (undefined2)lVar4;
    local_158._M_string_length._2_6_ = (undefined6)((ulong)lVar4 >> 0x10);
    rVar5 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)&local_158,rnd_generator);
    puVar1 = (this->mapped_inf_indices).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    *col_chosen = puVar1[rVar5];
    sVar8 = this->n_inf;
    this->n_inf = sVar8 - 1;
    uVar2 = puVar1[rVar5];
    puVar1[rVar5] = puVar1[sVar8 - 1];
    puVar1[sVar8 - 1] = uVar2;
  }
LAB_0025fb4e:
  this->n_left = this->n_left - 1;
  return true;
}

Assistant:

bool SingleNodeColumnSampler<ldouble_safe, real_t>::sample_col(size_t &col_chosen, RNG_engine &rnd_generator)
{
    if (!this->using_tree)
    {
        if (this->backup_weights)
            this->weights_orig = this->weights_own.data();

        /* if there's infinites, choose uniformly at random from them */
        if (this->n_inf)
        {
            size_t chosen = std::uniform_int_distribution<size_t>(0, this->n_inf-1)(rnd_generator);
            size_t curr = 0;
            for (size_t col = 0; col < this->curr_pos; col++)
            {
                curr += inifinite_weights[this->col_indices[col]];
                if (curr == chosen)
                {
                    col_chosen = this->col_indices[col];
                    this->n_inf--;
                    this->inifinite_weights[col_chosen] = false;
                    this->n_left--;
                    return true;
                }
            }
            assert(0);
        }

        if (!this->n_left) return false;

        /* due to the way this is calculated, there can be large roundoff errors and even negatives */
        if (this->cumw <= 0)
        {
            this->cumw = 0;
            for (size_t col = 0; col < this->curr_pos; col++)
                this->cumw += this->weights_orig[this->col_indices[col]];
            if (unlikely(this->cumw <= 0))
                unexpected_error();
        }

        /* if there are no infinites, choose a column according to weight */
        ldouble_safe chosen = std::uniform_real_distribution<ldouble_safe>((ldouble_safe)0, this->cumw)(rnd_generator);
        ldouble_safe cumw_ = 0;
        for (size_t col = 0; col < this->curr_pos; col++)
        {
            cumw_ += this->weights_orig[this->col_indices[col]];
            if (cumw_ >= chosen)
            {
                col_chosen = this->col_indices[col];
                this->cumw -= this->weights_orig[col_chosen];
                this->weights_orig[col_chosen] = 0;
                this->n_left--;
                return true;
            }
        }
        col_chosen = this->col_indices[this->curr_pos-1];
        this->cumw -= this->weights_orig[col_chosen];
        this->weights_orig[col_chosen] = 0;
        this->n_left--;
        return true;
    }

    else
    {
        /* if there's infinites, choose uniformly at random from them */
        if (this->n_inf)
        {
            size_t chosen = std::uniform_int_distribution<size_t>(0, this->n_inf-1)(rnd_generator);
            col_chosen = this->mapped_inf_indices[chosen];
            std::swap(this->mapped_inf_indices[chosen], this->mapped_inf_indices[--this->n_inf]);
            this->n_left--;
            return true;
        }

        else
        {
            /* TODO: should standardize all these tree traversals into one.
               This one in particular could do with sampling only a single
               random number as it will not typically require exhausting all
               options like the usual column sampler. */
            if (!this->n_left) return false;
            size_t curr_ix = 0;
            double rnd_subrange, w_left;
            double curr_subrange = this->tree_weights[0];
            if (curr_subrange <= 0)
                return false;

            for (size_t lev = 0; lev < tree_levels; lev++)
            {
                rnd_subrange = std::uniform_real_distribution<double>(0., curr_subrange)(rnd_generator);
                w_left = this->tree_weights[ix_child(curr_ix)];
                curr_ix = ix_child(curr_ix) + (rnd_subrange >= w_left);
                curr_subrange = this->tree_weights[curr_ix];
            }

            col_chosen = this->mapped_indices[curr_ix - this->offset];

            this->tree_weights[curr_ix] = 0.;
            for (size_t lev = 0; lev < this->tree_levels; lev++)
            {
                curr_ix = ix_parent(curr_ix);
                this->tree_weights[curr_ix] =   this->tree_weights[ix_child(curr_ix)]
                                              + this->tree_weights[ix_child(curr_ix) + 1];
            }
            
            this->n_left--;
            return true;
        }
    }
}